

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

void __thiscall maths::Matrix::~Matrix(Matrix *this)

{
  long lVar1;
  
  if (0 < this->rows_) {
    lVar1 = 0;
    do {
      if (this->p[lVar1] != (double *)0x0) {
        operator_delete__(this->p[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->rows_);
  }
  if (this->p != (double **)0x0) {
    operator_delete__(this->p);
    return;
  }
  return;
}

Assistant:

Matrix::~Matrix()
{
    for (int i = 0; i < rows_; ++i) {
        delete[] p[i];
    }
    delete[] p;
}